

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_event.c
# Opt level: O1

void duckdb_je_te_recompute_fast_threshold(tsd_t *tsd)

{
  ulong uVar1;
  
  if ((tsd->state).repr == '\0') {
    uVar1 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
    if (0xfffffffffffff000 <
        tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event) {
      uVar1 = 0;
    }
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast =
         uVar1;
    uVar1 = 0;
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event <
        0xfffffffffffff001) {
      uVar1 = tsd->
              cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
    }
    tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast =
         uVar1;
    if ((tsd->state).repr == '\0') {
      return;
    }
  }
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast = 0;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast = 0;
  return;
}

Assistant:

void
te_recompute_fast_threshold(tsd_t *tsd) {
	if (tsd_state_get(tsd) != tsd_state_nominal) {
		/* Check first because this is also called on purgatory. */
		te_next_event_fast_set_non_nominal(tsd);
		return;
	}

	te_ctx_t ctx;
	te_ctx_get(tsd, &ctx, true);
	te_ctx_next_event_fast_update(&ctx);
	te_ctx_get(tsd, &ctx, false);
	te_ctx_next_event_fast_update(&ctx);

	atomic_fence(ATOMIC_SEQ_CST);
	if (tsd_state_get(tsd) != tsd_state_nominal) {
		te_next_event_fast_set_non_nominal(tsd);
	}
}